

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&>::
streamReconstructedExpression
          (BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&> *this,
          ostream *os)

{
  string *lhs;
  char *pcVar1;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> in_RCX;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::
  rangeToString<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
            (&local_40,
             (Detail *)
             (this->m_lhs->super_vector<long,_std::allocator<long>_>).
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                      (this->m_lhs->super_vector<long,_std::allocator<long>_>).
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish,in_RCX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::
  rangeToString<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
            (&local_60,
             (Detail *)
             (this->m_rhs->super_vector<long,_std::allocator<long>_>).
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                      (this->m_rhs->super_vector<long,_std::allocator<long>_>).
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish,in_RCX);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }